

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalNinjaGenerator::AppendTargetDependsClosure
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,string *config,string *fileConfig,bool genexOutput,bool omit_self)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
  *this_00;
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  mapped_type *pmVar4;
  TargetDependSet *pTVar5;
  _Rb_tree_node_base *p_Var6;
  iterator __pos;
  string *config_00;
  __hashtable *__h;
  pointer pbVar7;
  _Base_ptr p_Var8;
  long *plVar9;
  cmNinjaDeps outs;
  __node_gen_type __node_gen_1;
  TargetDependsClosureKey key;
  undefined1 local_a8 [64];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  
  local_58._M_p = (pointer)&local_48;
  pcVar1 = (config->_M_dataplus)._M_p;
  local_60 = (undefined1  [8])target;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + config->_M_string_length);
  this_00 = &this->Configs;
  local_38 = genexOutput;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
           ::operator[](this_00,fileConfig);
  p_Var8 = (pmVar4->TargetDependsClosures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __pos._M_node = &(pmVar4->TargetDependsClosures)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var8 != (_Base_ptr)0x0) {
    do {
      bVar3 = operator<((TargetDependsClosureKey *)(p_Var8 + 1),(TargetDependsClosureKey *)local_60)
      ;
      if (!bVar3) {
        __pos._M_node = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[bVar3];
    } while (p_Var8 != (_Base_ptr)0x0);
  }
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
           ::operator[](this_00,fileConfig);
  if (((_Rb_tree_header *)__pos._M_node ==
       &(pmVar4->TargetDependsClosures)._M_t._M_impl.super__Rb_tree_header) ||
     (bVar3 = ::operator==((TargetDependsClosureKey *)(__pos._M_node + 1),
                           (TargetDependsClosureKey *)local_60), !bVar3)) {
    local_a8._0_8_ = local_a8 + 0x30;
    local_a8._8_8_ = (pointer)0x1;
    local_a8._16_8_ = (_Hash_node_base *)0x0;
    local_a8._24_8_ = 0;
    local_a8._32_4_ = 1.0;
    local_a8._40_8_ = 0;
    local_a8._48_8_ = (__node_base_ptr)0x0;
    pTVar5 = cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,target);
    for (p_Var6 = (pTVar5->
                  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 !=
        &(pTVar5->
         super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)._M_t
         ._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      bVar3 = cmGeneratorTarget::IsInBuildSystem(*(cmGeneratorTarget **)(p_Var6 + 1));
      if ((bVar3) &&
         (((bVar3 = IsSingleConfigUtility(this,target), bVar3 ||
           (bVar3 = IsSingleConfigUtility(this,*(cmGeneratorTarget **)(p_Var6 + 1)),
           bVar3 || (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) ||
          ((*(byte *)((long)&p_Var6[1]._M_parent + 2) | genexOutput) == 1)))) {
        config_00 = config;
        if (*(char *)((long)&p_Var6[1]._M_parent + 2) != '\0') {
          config_00 = fileConfig;
        }
        AppendTargetDependsClosure
                  (this,*(cmGeneratorTarget **)(p_Var6 + 1),
                   (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a8,config_00,fileConfig,genexOutput,false);
      }
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
             ::operator[](this_00,fileConfig);
    __pos = std::
            _Rb_tree<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,std::pair<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey_const,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey_const,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>,std::less<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey>,std::allocator<std::pair<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey_const,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>
            ::
            _M_emplace_hint_unique<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey&,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                      ((_Rb_tree<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,std::pair<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey_const,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey_const,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>,std::less<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey>,std::allocator<std::pair<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey_const,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>
                        *)&pmVar4->TargetDependsClosures,__pos._M_node,
                       (TargetDependsClosureKey *)local_60,
                       (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_a8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_a8);
  }
  plVar9 = *(long **)(__pos._M_node + 3);
  if (plVar9 != (long *)0x0) {
    local_a8._0_8_ = outputs;
    do {
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)outputs,plVar9 + 1,local_a8);
      plVar9 = (long *)*plVar9;
    } while (plVar9 != (long *)0x0);
  }
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (_Hash_node_base *)0x0;
  if ((!omit_self) &&
     (AppendTargetOutputs(this,target,(cmNinjaDeps *)local_a8,config,DependOnTargetArtifact),
     uVar2 = local_a8._8_8_, local_68 = outputs, local_a8._0_8_ != local_a8._8_8_)) {
    pbVar7 = (pointer)local_a8._0_8_;
    do {
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)outputs,pbVar7,&local_68);
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != (pointer)uVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetDependsClosure(
  cmGeneratorTarget const* target, std::unordered_set<std::string>& outputs,
  const std::string& config, const std::string& fileConfig, bool genexOutput,
  bool omit_self)
{

  // try to locate the target in the cache
  ByConfig::TargetDependsClosureKey key{
    target,
    config,
    genexOutput,
  };
  auto find = this->Configs[fileConfig].TargetDependsClosures.lower_bound(key);

  if (find == this->Configs[fileConfig].TargetDependsClosures.end() ||
      find->first != key) {
    // We now calculate the closure outputs by inspecting the dependent
    // targets recursively.
    // For that we have to distinguish between a local result set that is only
    // relevant for filling the cache entries properly isolated and a global
    // result set that is relevant for the result of the top level call to
    // AppendTargetDependsClosure.
    std::unordered_set<std::string>
      this_outs; // this will be the new cache entry

    for (auto const& dep_target : this->GetTargetDirectDepends(target)) {
      if (!dep_target->IsInBuildSystem()) {
        continue;
      }

      if (!this->IsSingleConfigUtility(target) &&
          !this->IsSingleConfigUtility(dep_target) &&
          this->EnableCrossConfigBuild() && !dep_target.IsCross() &&
          !genexOutput) {
        continue;
      }

      if (dep_target.IsCross()) {
        this->AppendTargetDependsClosure(dep_target, this_outs, fileConfig,
                                         fileConfig, genexOutput, false);
      } else {
        this->AppendTargetDependsClosure(dep_target, this_outs, config,
                                         fileConfig, genexOutput, false);
      }
    }
    find = this->Configs[fileConfig].TargetDependsClosures.emplace_hint(
      find, key, std::move(this_outs));
  }

  // now fill the outputs of the final result from the newly generated cache
  // entry
  outputs.insert(find->second.begin(), find->second.end());

  // finally generate the outputs of the target itself, if applicable
  cmNinjaDeps outs;
  if (!omit_self) {
    this->AppendTargetOutputs(target, outs, config, DependOnTargetArtifact);
  }
  outputs.insert(outs.begin(), outs.end());
}